

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t
zesFirmwareGetConsoleLogs(zes_firmware_handle_t hFirmware,size_t *pSize,char *pFirmwareLog)

{
  zes_pfnFirmwareGetConsoleLogs_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFirmwareGetConsoleLogs_t pfnGetConsoleLogs;
  char *pFirmwareLog_local;
  size_t *pSize_local;
  zes_firmware_handle_t hFirmware_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Firmware).pfnGetConsoleLogs;
    if (p_Var1 == (zes_pfnFirmwareGetConsoleLogs_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hFirmware_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hFirmware_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hFirmware_local._4_4_ = (*p_Var1)(hFirmware,pSize,pFirmwareLog);
    }
  }
  else {
    hFirmware_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hFirmware_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFirmwareGetConsoleLogs(
    zes_firmware_handle_t hFirmware,                ///< [in] Handle for the component.
    size_t* pSize,                                  ///< [in,out] size of firmware log
    char* pFirmwareLog                              ///< [in,out][optional] pointer to null-terminated string of the log.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFirmwareGetConsoleLogs_t pfnGetConsoleLogs = [&result] {
        auto pfnGetConsoleLogs = ze_lib::context->zesDdiTable.load()->Firmware.pfnGetConsoleLogs;
        if( nullptr == pfnGetConsoleLogs ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetConsoleLogs;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetConsoleLogs( hFirmware, pSize, pFirmwareLog );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetConsoleLogs = ze_lib::context->zesDdiTable.load()->Firmware.pfnGetConsoleLogs;
    if( nullptr == pfnGetConsoleLogs ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetConsoleLogs( hFirmware, pSize, pFirmwareLog );
    #endif
}